

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiColumnsSet *columns_00;
  ImGuiWindow *pIVar1;
  value_type *pvVar2;
  float fVar3;
  ImGuiColumnsSet *columns;
  ImGuiWindow *window;
  int column_index_local;
  
  pIVar1 = GetCurrentWindowRead();
  columns_00 = (pIVar1->DC).ColumnsSet;
  if (columns_00 != (ImGuiColumnsSet *)0x0) {
    window._4_4_ = column_index;
    if (column_index < 0) {
      window._4_4_ = columns_00->Current;
    }
    pvVar2 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,window._4_4_ + 1);
    fVar3 = pvVar2->OffsetNorm;
    pvVar2 = ImVector<ImGuiColumnData>::operator[](&columns_00->Columns,window._4_4_);
    fVar3 = OffsetNormToPixels(columns_00,fVar3 - pvVar2->OffsetNorm);
    return fVar3;
  }
  __assert_fail("columns != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x3210,"float ImGui::GetColumnWidth(int)");
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    if (column_index < 0)
        column_index = columns->Current;
    return OffsetNormToPixels(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}